

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O3

optional<std::pair<unsigned_long,_unsigned_long>_> * __thiscall
google::protobuf::io::Printer::GetSubstitutionRange
          (optional<std::pair<unsigned_long,_unsigned_long>_> *__return_storage_ptr__,Printer *this,
          string_view varname,PrintOptions opts)

{
  slot_type *psVar1;
  anon_union_8_1_a8a14541_for_iterator_2 aVar2;
  bool bVar3;
  pointer prVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_00;
  PrintOptions opts_00;
  PrintOptions opts_01;
  iterator it;
  iterator local_88;
  key_arg<std::basic_string_view<char>_> local_78;
  size_t local_68;
  char *pcStack_60;
  iterator local_50;
  size_t local_40;
  char *pcStack_38;
  
  uVar5 = opts._0_8_;
  local_78._M_str = varname._M_str;
  local_78._M_len = varname._M_len;
  local_88 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
             ::find<std::basic_string_view<char,std::char_traits<char>>>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                         *)&this->substitutions_,&local_78);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)&this->substitutions_);
  local_50.ctrl_ = (ctrl_t *)0x0;
  bVar3 = absl::lts_20250127::container_internal::operator==(&local_88,&local_50);
  local_68 = local_78._M_len;
  pcStack_60 = local_78._M_str;
  message.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::io::Printer::GetSubstitutionRange(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions)::__0,std::__cxx11::string>
  ;
  message.ptr_.obj = &local_68;
  opts_00.use_annotation_frames = SUB81(extraout_RDX,0);
  opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)(short)uVar5;
  opts_00.checks_are_debug_only = (bool)(char)((ulong)uVar5 >> 0x10);
  opts_00.use_substitution_map = (bool)(char)((ulong)uVar5 >> 0x18);
  opts_00.use_curly_brace_substitutions = (bool)(char)((ulong)uVar5 >> 0x20);
  opts_00.allow_digit_substitutions = (bool)(char)((ulong)uVar5 >> 0x28);
  opts_00.strip_spaces_around_vars = (bool)(char)((ulong)uVar5 >> 0x30);
  opts_00.strip_raw_string_indentation = (bool)(char)((ulong)uVar5 >> 0x38);
  Validate(!bVar3,opts_00,message);
  if (!bVar3) {
    prVar4 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::iterator::operator->(&local_88);
    psVar1 = (slot_type *)(prVar4->second).first;
    aVar2 = (anon_union_8_1_a8a14541_for_iterator_2)(prVar4->second).second;
    local_40 = local_78._M_len;
    pcStack_38 = local_78._M_str;
    message_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::io::Printer::GetSubstitutionRange(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
    ;
    message_00.ptr_.obj = &local_50;
    opts_01.use_annotation_frames = SUB81(extraout_RDX_00,0);
    opts_01.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)(short)uVar5;
    opts_01.checks_are_debug_only = (bool)(char)((ulong)uVar5 >> 0x10);
    opts_01.use_substitution_map = (bool)(char)((ulong)uVar5 >> 0x18);
    opts_01.use_curly_brace_substitutions = (bool)(char)((ulong)uVar5 >> 0x20);
    opts_01.allow_digit_substitutions = (bool)(char)((ulong)uVar5 >> 0x28);
    opts_01.strip_spaces_around_vars = (bool)(char)((ulong)uVar5 >> 0x30);
    opts_01.strip_raw_string_indentation = (bool)(char)((ulong)uVar5 >> 0x38);
    local_50.ctrl_ = (ctrl_t *)psVar1;
    local_50.field_1 = aVar2;
    Validate(psVar1 <= aVar2.slot_,opts_01,message_00);
    if (psVar1 <= aVar2.slot_) {
      (__return_storage_ptr__->
      super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>)._M_payload.
      super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_payload._M_value.
      first = (unsigned_long)psVar1;
      (__return_storage_ptr__->
      super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>)._M_payload.
      super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_payload._M_value.
      second = (unsigned_long)aVar2;
      bVar3 = true;
      goto LAB_002d55df;
    }
  }
  bVar3 = false;
LAB_002d55df:
  (__return_storage_ptr__->super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>
  )._M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged =
       bVar3;
  return __return_storage_ptr__;
}

Assistant:

absl::optional<std::pair<size_t, size_t>> Printer::GetSubstitutionRange(
    absl::string_view varname, PrintOptions opts) {
  auto it = substitutions_.find(varname);
  if (!Validate(it != substitutions_.end(), opts, [varname] {
        return absl::StrCat("undefined variable in annotation: ", varname);
      })) {
    return absl::nullopt;
  }

  std::pair<size_t, size_t> range = it->second;
  if (!Validate(range.first <= range.second, opts, [range, varname] {
        return absl::StrFormat(
            "variable used for annotation used multiple times: %s (%d..%d)",
            varname, range.first, range.second);
      })) {
    return absl::nullopt;
  }

  return range;
}